

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O2

void __thiscall
Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
          (Parser *this,ParseNodePtr patternNode,anon_class_16_2_85211fcd handler)

{
  ParseNode *pPVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  ParseNodeBin *pPVar5;
  undefined4 *puVar6;
  ParseNodeArrLit *pPVar7;
  ParseNodeUni *pPVar8;
  ParseNodePtr *ppPVar9;
  anon_class_8_1_aca58a2a local_40;
  anon_class_8_1_aca58a2a local_38;
  ParseNodePtr local_30;
  Parser *local_28;
  anon_class_16_2_85211fcd handler_local;
  
  handler_local.this = handler.this;
  OVar4 = *(OpCode *)
           &(this->m_nodeAllocator).
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_Allocator
            .outOfMemoryFunc;
  local_28 = (Parser *)patternNode;
  if (OVar4 == knopAsg) {
    pPVar5 = ParseNode::AsParseNodeBin((ParseNode *)this);
    this = (Parser *)pPVar5->pnode1;
    OVar4 = *(OpCode *)
             &(this->m_nodeAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_Allocator.outOfMemoryFunc;
  }
  if ((OVar4 & ~knopInt) != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    OVar4 = *(OpCode *)
             &(this->m_nodeAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_Allocator.outOfMemoryFunc;
  }
  if (OVar4 == knopArrayPattern) {
    pPVar7 = ParseNode::AsParseNodeArrLit((ParseNode *)this);
    local_38.handler = (anon_class_32_4_34db34f2 *)&local_28;
    local_40.handler = &local_38;
    ppPVar9 = &local_30;
    local_30 = (pPVar7->super_ParseNodeUni).pnode1;
    while ((ppPVar9 != (ParseNodePtr *)0x0 && (pPVar1 = *ppPVar9, pPVar1 != (ParseNode *)0x0))) {
      if (pPVar1->nop == knopList) {
        pPVar5 = ParseNode::AsParseNodeBin(pPVar1);
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_40,&pPVar5->pnode1);
        pPVar5 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar5->pnode2;
      }
      else {
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_40,ppPVar9);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    }
  }
  else {
    pPVar8 = ParseNode::AsParseNodeUni((ParseNode *)this);
    local_38.handler = (anon_class_32_4_34db34f2 *)&local_28;
    local_40.handler = &local_38;
    ppPVar9 = &local_30;
    local_30 = pPVar8->pnode1;
    while ((ppPVar9 != (ParseNodePtr *)0x0 && (pPVar1 = *ppPVar9, pPVar1 != (ParseNode *)0x0))) {
      if (pPVar1->nop == knopList) {
        pPVar5 = ParseNode::AsParseNodeBin(pPVar1);
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_40,&pPVar5->pnode1);
        pPVar5 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar5->pnode2;
      }
      else {
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_40,ppPVar9);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }